

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O2

void __thiscall QFontCache::decreaseCache(QFontCache *this)

{
  EngineCache *this_00;
  QHash<QFontEngine_*,_int> *this_01;
  QBasicTimer *this_02;
  _Base_ptr *key;
  uint uVar1;
  QMapData<std::map<QFontDef,_QFontEngineData_*,_std::less<QFontDef>,_std::allocator<std::pair<const_QFontDef,_QFontEngineData_*>_>_>_>
  *pQVar2;
  QMapData<std::multimap<QFontCache::Key,_QFontCache::Engine,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>_>
  *pQVar3;
  QFontEngineData *this_03;
  int iVar4;
  uint uVar5;
  int iVar6;
  _Rb_tree_node_base *p_Var7;
  _Base_ptr p_Var8;
  iterator it;
  iterator iVar9;
  iterator iVar10;
  iterator iVar11;
  uint uVar12;
  EngineDataCache *this_04;
  _Rb_tree_node_base *p_Var13;
  int iVar14;
  long in_FS_OFFSET;
  iterator local_58;
  QFontEngine *fontEngine;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->engineDataCache).d.d.ptr;
  if (pQVar2 == (QMapData<std::map<QFontDef,_QFontEngineData_*,_std::less<QFontDef>,_std::allocator<std::pair<const_QFontDef,_QFontEngineData_*>_>_>_>
                 *)0x0) {
    p_Var7 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var7 = (pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  this_04 = &this->engineDataCache;
  p_Var13 = &(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  iVar14 = 0;
  if (pQVar2 == (QMapData<std::map<QFontDef,_QFontEngineData_*,_std::less<QFontDef>,_std::allocator<std::pair<const_QFontDef,_QFontEngineData_*>_>_>_>
                 *)0x0) {
    p_Var13 = (_Rb_tree_node_base *)0x0;
    iVar14 = 0;
  }
  for (; p_Var7 != p_Var13; p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    iVar6 = iVar14 + 0x568;
    if ((p_Var7[4]._M_parent)->_M_color == _S_black) {
      iVar6 = iVar14;
    }
    iVar14 = iVar6;
  }
  pQVar3 = (this->engineCache).d.d.ptr;
  if (pQVar3 == (QMapData<std::multimap<QFontCache::Key,_QFontCache::Engine,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>_>
                 *)0x0) {
    p_Var8 = (_Base_ptr)0x0;
  }
  else {
    p_Var8 = (pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  this_00 = &this->engineCache;
  p_Var7 = &(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar3 == (QMapData<std::multimap<QFontCache::Key,_QFontCache::Engine,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>_>
                 *)0x0) {
    p_Var7 = (_Rb_tree_node_base *)0x0;
  }
  this_01 = &this->engineCacheCount;
  for (; p_Var8 != p_Var7; p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
    key = &p_Var8[4]._M_left;
    iVar6 = *(int *)((long)&(p_Var8[4]._M_left)->_M_parent + 4);
    iVar4 = QHash<QFontEngine_*,_int>::value(this_01,(QFontEngine **)key);
    if (iVar4 < iVar6) {
      uVar12 = *(uint *)&(*key)[5]._M_parent;
      uVar5 = QHash<QFontEngine_*,_int>::value(this_01,(QFontEngine **)key);
      iVar14 = iVar14 + uVar12 / uVar5;
    }
  }
  pQVar3 = (this_00->d).d.ptr;
  iVar6 = 0x200;
  if (pQVar3 != (QMapData<std::multimap<QFontCache::Key,_QFontCache::Engine,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>_>
                 *)0x0) {
    iVar6 = (int)(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x200;
  }
  uVar5 = (uint)(iVar6 + iVar14) >> 10;
  uVar12 = this->max_cost >> 1;
  if (uVar12 <= uVar5) {
    uVar12 = uVar5;
  }
  uVar5 = 0x1000;
  if (0x1000 < uVar12) {
    uVar5 = uVar12;
  }
  if ((this->autoClean == true) && (uVar5 == this->max_cost)) {
    this_02 = &this->timer;
    if (this->fast == true) {
      if (this_02->m_id != Invalid) {
        QBasicTimer::start(this_02,(Duration)0x45d964b800,&this->super_QObject);
        this->fast = false;
      }
      goto LAB_0041a38c;
    }
    QBasicTimer::start(this_02,(Duration)0x2540be400,&this->super_QObject);
    this->fast = true;
  }
  this->max_cost = uVar5;
  it._M_node = (_Base_ptr)QMap<QFontDef,_QFontEngineData_*>::begin(this_04);
  while( true ) {
    iVar9 = QMap<QFontDef,_QFontEngineData_*>::end(this_04);
    if ((iterator)it._M_node == iVar9.i._M_node) break;
    p_Var8 = it._M_node[4]._M_parent;
    if (p_Var8->_M_color == _S_black) {
      this->total_cost = this->total_cost - 1;
      LOCK();
      p_Var8->_M_color = p_Var8->_M_color - _S_black;
      UNLOCK();
      this_03 = (QFontEngineData *)it._M_node[4]._M_parent;
      if (this_03 != (QFontEngineData *)0x0) {
        QFontEngineData::~QFontEngineData(this_03);
      }
      operator_delete(this_03,0x568);
      it._M_node = (_Base_ptr)QMap<QFontDef,_QFontEngineData_*>::erase(this_04,it._M_node);
    }
    else {
      it._M_node = (_Base_ptr)std::_Rb_tree_increment(it._M_node);
    }
  }
  do {
    iVar10._M_node = (_Base_ptr)QMultiMap<QFontCache::Key,_QFontCache::Engine>::begin(this_00);
    iVar11 = QMultiMap<QFontCache::Key,_QFontCache::Engine>::end(this_00);
    uVar12 = 0xffffffff;
    uVar5 = 0xffffffff;
    local_58 = iVar11.i._M_node;
    for (; (iterator)iVar10._M_node != iVar11.i._M_node;
        iVar10._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar10._M_node)) {
      iVar14 = *(int *)((long)&(iVar10._M_node[4]._M_left)->_M_parent + 4);
      iVar6 = QHash<QFontEngine_*,_int>::value(this_01,(QFontEngine **)&iVar10._M_node[4]._M_left);
      if (((iVar14 == iVar6) && (*(uint *)&iVar10._M_node[4]._M_right < uVar5)) &&
         (uVar1 = *(uint *)((long)&iVar10._M_node[4]._M_right + 4), uVar1 <= uVar12)) {
        local_58._M_node = iVar10._M_node;
        uVar5 = *(uint *)&iVar10._M_node[4]._M_right;
        uVar12 = uVar1;
      }
    }
    if ((iterator)local_58._M_node == iVar11.i._M_node) break;
    fontEngine = (QFontEngine *)local_58._M_node[4]._M_left;
    iVar10._M_node = (_Base_ptr)QMultiMap<QFontCache::Key,_QFontCache::Engine>::begin(this_00);
    while( true ) {
      iVar11 = QMultiMap<QFontCache::Key,_QFontCache::Engine>::end(this_00);
      if ((iterator)iVar10._M_node == iVar11.i._M_node) break;
      if ((QFontEngine *)iVar10._M_node[4]._M_left == fontEngine) {
        LOCK();
        (fontEngine->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (fontEngine->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        iVar10._M_node =
             (_Base_ptr)
             QMultiMap<QFontCache::Key,_QFontCache::Engine>::erase(this_00,iVar10._M_node);
      }
      else {
        iVar10._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar10._M_node);
      }
    }
    uVar12 = fontEngine->cache_cost + 0x200;
    uVar5 = uVar12 >> 10;
    if (uVar12 < 0x400) {
      uVar5 = 1;
    }
    this->total_cost = this->total_cost - uVar5;
    (*fontEngine->_vptr_QFontEngine[1])();
    QHash<QFontEngine*,int>::removeImpl<QFontEngine*>
              ((QHash<QFontEngine*,int> *)this_01,&fontEngine);
  } while (this->max_cost < this->total_cost);
LAB_0041a38c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontCache::decreaseCache()
{
    // go through the cache and count up everything in use
    uint in_use_cost = 0;

    {
        FC_DEBUG("  SWEEP engine data:");

        // make sure the cost of each engine data is at least 1kb
        const uint engine_data_cost =
            sizeof(QFontEngineData) > 1024 ? sizeof(QFontEngineData) : 1024;

        EngineDataCache::ConstIterator it = engineDataCache.constBegin(),
                                      end = engineDataCache.constEnd();
        for (; it != end; ++it) {
            FC_DEBUG("    %p: ref %2d", it.value(), int(it.value()->ref.loadRelaxed()));

            if (it.value()->ref.loadRelaxed() != 1)
                in_use_cost += engine_data_cost;
        }
    }

    {
        FC_DEBUG("  SWEEP engine:");

        EngineCache::ConstIterator it = engineCache.constBegin(),
                                  end = engineCache.constEnd();
        for (; it != end; ++it) {
            FC_DEBUG("    %p: timestamp %4u hits %2u ref %2d/%2d, cost %u bytes",
                     it.value().data, it.value().timestamp, it.value().hits,
                     it.value().data->ref.loadRelaxed(), engineCacheCount.value(it.value().data),
                     it.value().data->cache_cost);

            if (it.value().data->ref.loadRelaxed() > engineCacheCount.value(it.value().data))
                in_use_cost += it.value().data->cache_cost / engineCacheCount.value(it.value().data);
        }

        // attempt to make up for rounding errors
        in_use_cost += engineCache.size();
    }

    in_use_cost = (in_use_cost + 512) / 1024; // cost is stored in kb

    /*
      calculate the new maximum cost for the cache

      NOTE: in_use_cost is *not* correct due to rounding errors in the
      above algorithm.  instead of worrying about getting the
      calculation correct, we are more interested in speed, and use
      in_use_cost as a floor for new_max_cost
    */
    uint new_max_cost = qMax(qMax(max_cost / 2, in_use_cost), min_cost);

    FC_DEBUG("  after sweep, in use %u kb, total %u kb, max %u kb, new max %u kb",
              in_use_cost, total_cost, max_cost, new_max_cost);

    if (autoClean) {
        if (new_max_cost == max_cost) {
            if (fast) {
                FC_DEBUG("  cannot shrink cache, slowing timer");

                if (timer.isActive()) {
                    timer.start(slow_timeout, this);
                fast = false;
            }

            return;
        } else if (! fast) {
            FC_DEBUG("  dropping into passing gear");

            timer.start(fast_timeout, this);
            fast = true;        }
        }
    }

    max_cost = new_max_cost;

    {
        FC_DEBUG("  CLEAN engine data:");

        // clean out all unused engine data
        EngineDataCache::Iterator it = engineDataCache.begin();
        while (it != engineDataCache.end()) {
            if (it.value()->ref.loadRelaxed() == 1) {
                FC_DEBUG("    %p", it.value());
                decreaseCost(sizeof(QFontEngineData));
                it.value()->ref.deref();
                delete it.value();
                it = engineDataCache.erase(it);
            } else {
                ++it;
            }
        }
    }

    FC_DEBUG("  CLEAN engine:");

    // clean out the engine cache just enough to get below our new max cost
    bool cost_decreased;
    do {
        cost_decreased = false;

        EngineCache::Iterator it = engineCache.begin(),
                             end = engineCache.end();
        // determine the oldest and least popular of the unused engines
        uint oldest = ~0u;
        uint least_popular = ~0u;

        EngineCache::Iterator jt = end;

        for ( ; it != end; ++it) {
            if (it.value().data->ref.loadRelaxed() != engineCacheCount.value(it.value().data))
                continue;

            if (it.value().timestamp < oldest && it.value().hits <= least_popular) {
                oldest = it.value().timestamp;
                least_popular = it.value().hits;
                jt = it;
            }
        }

        it = jt;
        if (it != end) {
            FC_DEBUG("    %p: timestamp %4u hits %2u ref %2d/%2d, type %d",
                     it.value().data, it.value().timestamp, it.value().hits,
                     it.value().data->ref.loadRelaxed(), engineCacheCount.value(it.value().data),
                     it.value().data->type());

            QFontEngine *fontEngine = it.value().data;
            // get rid of all occurrences
            it = engineCache.begin();
            while (it != engineCache.end()) {
                if (it.value().data == fontEngine) {
                    fontEngine->ref.deref();
                    it = engineCache.erase(it);
                } else {
                    ++it;
                }
            }
            // and delete the last occurrence
            Q_ASSERT(fontEngine->ref.loadRelaxed() == 0);
            decreaseCost(fontEngine->cache_cost);
            delete fontEngine;
            engineCacheCount.remove(fontEngine);

            cost_decreased = true;
        }
    } while (cost_decreased && total_cost > max_cost);
}